

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

void __thiscall QDoubleSpinBox::setRange(QDoubleSpinBox *this,double minimum,double maximum)

{
  QDoubleSpinBoxPrivate *this_00;
  long in_FS_OFFSET;
  double dVar1;
  QVariant local_60;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDoubleSpinBoxPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  this_00->actualMin = minimum;
  this_00->actualMax = maximum;
  dVar1 = QDoubleSpinBoxPrivate::round(this_00,minimum);
  ::QVariant::QVariant(&local_40,dVar1);
  dVar1 = QDoubleSpinBoxPrivate::round(this_00,maximum);
  ::QVariant::QVariant(&local_60,dVar1);
  (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xb0))
            (this_00,&local_40,&local_60);
  ::QVariant::~QVariant(&local_60);
  ::QVariant::~QVariant(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDoubleSpinBox::setRange(double minimum, double maximum)
{
    Q_D(QDoubleSpinBox);
    d->actualMin = minimum;
    d->actualMax = maximum;
    d->setRange(QVariant(d->round(minimum)), QVariant(d->round(maximum)));
}